

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3Utf16to8(sqlite3 *db,void *z,int nByte,u8 enc)

{
  Mem m;
  MemValue local_48;
  undefined8 uStack_40;
  char *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  sqlite3 *psStack_20;
  undefined8 local_18;
  
  local_28 = 0;
  local_38 = (char *)0x0;
  uStack_30 = 0;
  local_48.r = 0.0;
  uStack_40 = 0;
  local_18 = 0;
  psStack_20 = db;
  sqlite3VdbeMemSetStr((Mem *)&local_48,(char *)z,nByte,'\x02',(_func_void_void_ptr *)0x0);
  if (((uStack_40 & 2) != 0) && (uStack_40._2_1_ != '\x01')) {
    sqlite3VdbeMemTranslate((Mem *)&local_48,'\x01');
  }
  if (db->mallocFailed != '\0') {
    if (((uStack_40 & 0x2400) != 0) || ((int)local_28 != 0)) {
      vdbeMemClear((Mem *)&local_48);
    }
    local_38 = (char *)0x0;
  }
  return local_38;
}

Assistant:

SQLITE_PRIVATE char *sqlite3Utf16to8(sqlite3 *db, const void *z, int nByte, u8 enc){
  Mem m;
  memset(&m, 0, sizeof(m));
  m.db = db;
  sqlite3VdbeMemSetStr(&m, z, nByte, enc, SQLITE_STATIC);
  sqlite3VdbeChangeEncoding(&m, SQLITE_UTF8);
  if( db->mallocFailed ){
    sqlite3VdbeMemRelease(&m);
    m.z = 0;
  }
  assert( (m.flags & MEM_Term)!=0 || db->mallocFailed );
  assert( (m.flags & MEM_Str)!=0 || db->mallocFailed );
  assert( m.z || db->mallocFailed );
  return m.z;
}